

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O2

void __thiscall Opcode::AABBNoLeafTree::~AABBNoLeafTree(AABBNoLeafTree *this)

{
  ~AABBNoLeafTree(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

AABBNoLeafTree::~AABBNoLeafTree()
{
	DELETEARRAY(mNodes);
}